

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cavlc.c
# Opt level: O3

int h264_coeff_token(bitstream *str,h264_slice *slice,int cat,int idx,uint32_t *trailingOnes,
                    uint32_t *totalCoeff)

{
  bitstream *pbVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  int iVar5;
  h264_macroblock *phVar6;
  h264_macroblock *phVar7;
  uint inter;
  int iVar8;
  vs_vlc_val *tab;
  h264_block_size bs;
  long lVar9;
  uint32_t tmp;
  int idxA;
  int idxB;
  uint local_58;
  int local_54;
  bitstream *local_50;
  uint *local_48;
  uint *local_40;
  int local_34;
  
  local_50 = str;
  local_48 = trailingOnes;
  local_40 = totalCoeff;
  switch(cat) {
  case 0:
  case 1:
  case 2:
  case 5:
    bs = H264_BLOCK_4X4;
    lVar9 = 0;
    break;
  case 3:
    tab = coeff_token_m2;
    if (slice->chroma_array_type == 1) {
      tab = coeff_token_m1;
    }
    goto LAB_00108431;
  case 4:
    iVar5 = idx >> 3;
    idx = idx & 7;
    lVar9 = (long)(iVar5 + 1);
    bs = H264_BLOCK_CHROMA;
    break;
  case 6:
  case 7:
  case 8:
  case 9:
    bs = H264_BLOCK_4X4;
    lVar9 = 1;
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    bs = H264_BLOCK_4X4;
    lVar9 = 2;
    break;
  default:
    abort();
  }
  phVar6 = h264_mb_nb_p(slice,H264_MB_THIS,0);
  inter = (uint)(0x1a < phVar6->mb_type);
  phVar6 = h264_mb_nb_b(slice,H264_MB_A,bs,inter,idx,&local_54);
  phVar7 = h264_mb_nb_b(slice,H264_MB_B,bs,inter,idx,&local_34);
  phVar6 = h264_inter_filter(slice,phVar6,inter);
  phVar7 = h264_inter_filter(slice,phVar7,inter);
  iVar5 = phVar6->total_coeff[lVar9][local_54];
  iVar4 = phVar7->total_coeff[lVar9][local_34];
  if ((phVar6->mb_type == 0x39) || (phVar7->mb_type == 0x39)) {
    iVar8 = 0;
    if (phVar7->mb_type != 0x39) {
      iVar8 = iVar4;
    }
    if (phVar6->mb_type != 0x39) {
      iVar8 = iVar5;
    }
  }
  else {
    iVar8 = iVar4 + iVar5 + 1 >> 1;
  }
  tab = (vs_vlc_val *)(coeff_token_tab_rel + *(int *)(coeff_token_tab_rel + (long)iVar8 * 4));
LAB_00108431:
  puVar3 = local_40;
  puVar2 = local_48;
  pbVar1 = local_50;
  local_58 = *local_48 << 8 | *local_40;
  iVar4 = vs_vlc(local_50,&local_58,tab);
  iVar5 = 1;
  if (iVar4 == 0) {
    iVar5 = 0;
    if (pbVar1->dir == VS_DECODE) {
      *puVar2 = local_58 >> 8;
      *puVar3 = local_58 & 0xff;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int h264_coeff_token(struct bitstream *str, struct h264_slice *slice, int cat, int idx, uint32_t *trailingOnes, uint32_t *totalCoeff) {
	const struct vs_vlc_val *tab = 0;
	enum h264_block_size bs;
	int which;
	switch (cat) {
		case H264_CTXBLOCKCAT_CHROMA_DC:
			if (slice->chroma_array_type == 1)
				tab = coeff_token_m1;
			else
				tab = coeff_token_m2;
			break;
		case H264_CTXBLOCKCAT_CHROMA_AC:
			which = (idx >> 3) + 1;
			idx &= 7;
			bs = H264_BLOCK_CHROMA;
			break;
		case H264_CTXBLOCKCAT_LUMA_DC:
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
		case H264_CTXBLOCKCAT_LUMA_8X8:
			which = 0;
			bs = H264_BLOCK_4X4;
			break;
		case H264_CTXBLOCKCAT_CB_DC:
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
		case H264_CTXBLOCKCAT_CB_8X8:
			which = 1;
			bs = H264_BLOCK_4X4;
			break;
		case H264_CTXBLOCKCAT_CR_DC:
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
		case H264_CTXBLOCKCAT_CR_8X8:
			which = 2;
			bs = H264_BLOCK_4X4;
			break;
		default:
			abort();
	}
	if (!tab) {
		int idxA, idxB;
		const struct h264_macroblock *mbT = h264_mb_nb_p(slice, H264_MB_THIS, 0);
		int inter = h264_is_inter_mb_type(mbT->mb_type);
		const struct h264_macroblock *mbA = h264_mb_nb_b(slice, H264_MB_A, bs, inter, idx, &idxA);
		const struct h264_macroblock *mbB = h264_mb_nb_b(slice, H264_MB_B, bs, inter, idx, &idxB);
		mbA = h264_inter_filter(slice, mbA, inter);
		mbB = h264_inter_filter(slice, mbB, inter);
		int availA = mbA->mb_type != H264_MB_TYPE_UNAVAIL;
		int availB = mbB->mb_type != H264_MB_TYPE_UNAVAIL;
		int nA = mbA->total_coeff[which][idxA];
		int nB = mbB->total_coeff[which][idxB];
		int nC;
		if (availA && availB)
			nC = (nA + nB + 1) >> 1;
		else if (availA)
			nC = nA;
		else if (availB)
			nC = nB;
		else
			nC = 0;
		tab = coeff_token_tab[nC];
	}
	uint32_t tmp;
	tmp = *trailingOnes << 8 | *totalCoeff;
	if (vs_vlc(str, &tmp, tab)) return 1;
	if (str->dir == VS_DECODE) {
		*trailingOnes = tmp >> 8;
		*totalCoeff = tmp & 0xff;
	}
	return 0;
}